

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.c
# Opt level: O3

int str_format(lua_State *L)

{
  byte *__src;
  ushort *puVar1;
  byte bVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  byte *pbVar6;
  undefined1 (*pauVar7) [64];
  void *pvVar8;
  ushort **ppuVar9;
  char *pcVar10;
  ulong uVar11;
  char *pcVar12;
  size_t sVar13;
  lconv *plVar14;
  undefined1 *puVar15;
  int arg;
  lua_Number lVar16;
  byte *pbVar17;
  size_t sVar18;
  bool bVar19;
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  size_t l;
  char form [32];
  size_t sfl;
  luaL_Buffer b;
  size_t local_20b0;
  undefined2 local_20a8;
  lua_Number local_20a0;
  byte *local_2098;
  undefined4 local_208c;
  char local_2088 [40];
  lua_Number local_2060;
  size_t local_2058;
  luaL_Buffer local_2050;
  
  local_208c = lua_gettop(L);
  pbVar6 = (byte *)luaL_checklstring(L,1,&local_2058);
  luaL_buffinit(L,&local_2050);
  if (0 < (long)local_2058) {
    pbVar17 = pbVar6 + local_2058;
    iVar5 = 1;
    local_2098 = pbVar17;
    do {
      bVar2 = *pbVar6;
      if (bVar2 != 0x25) {
        if (local_2050.size <= local_2050.n) {
          luaL_prepbuffsize(&local_2050,1);
          bVar2 = *pbVar6;
        }
        pbVar6 = pbVar6 + 1;
        local_2050.b[local_2050.n] = bVar2;
        local_2050.n = local_2050.n + 1;
        goto LAB_0013ffaa;
      }
      __src = pbVar6 + 1;
      if (pbVar6[1] == 0x25) {
        bVar2 = 0x25;
        if (local_2050.size <= local_2050.n) {
          luaL_prepbuffsize(&local_2050,1);
          bVar2 = *__src;
        }
        pbVar6 = pbVar6 + 2;
        local_2050.b[local_2050.n] = bVar2;
        local_2050.n = local_2050.n + 1;
        goto LAB_0013ffaa;
      }
      pauVar7 = (undefined1 (*) [64])luaL_prepbuffsize(&local_2050,0x78);
      arg = iVar5 + 1;
      if (local_208c <= iVar5) {
        iVar5 = luaL_argerror(L,arg,"no value");
        return iVar5;
      }
      bVar2 = *__src;
      pbVar6 = __src;
      if (bVar2 == 0) {
        bVar2 = 0;
      }
      else {
        do {
          pvVar8 = memchr("-+ #0",(int)(char)bVar2,6);
          if (pvVar8 == (void *)0x0) goto LAB_0013fae2;
          bVar2 = pbVar6[1];
          pbVar6 = pbVar6 + 1;
        } while (bVar2 != 0);
        bVar2 = 0;
      }
LAB_0013fae2:
      if (5 < (ulong)((long)pbVar6 - (long)__src)) {
        luaL_error(L,"invalid format (repeated flags)");
        bVar2 = *pbVar6;
      }
      ppuVar9 = __ctype_b_loc();
      puVar1 = *ppuVar9;
      uVar11 = (ulong)(puVar1[bVar2] >> 0xb & 1);
      pbVar6 = pbVar6 + ((puVar1[pbVar6[uVar11]] >> 0xb & 1) != 0) + uVar11;
      bVar2 = *pbVar6;
      if (bVar2 == 0x2e) {
        bVar19 = (*(byte *)((long)puVar1 + (ulong)pbVar6[1] * 2 + 1) & 8) == 0;
        pbVar17 = pbVar6 + 2;
        if (bVar19) {
          pbVar17 = pbVar6 + 1;
        }
        pbVar6 = pbVar17 + ((puVar1[pbVar6[2 - (ulong)bVar19]] >> 0xb & 1) != 0);
        bVar2 = *pbVar6;
      }
      if ((*(byte *)((long)puVar1 + (ulong)bVar2 * 2 + 1) & 8) != 0) {
        luaL_error(L,"invalid format (width or precision too long)");
      }
      local_2088[0] = '%';
      memcpy(local_2088 + 1,__src,(size_t)(pbVar6 + (1 - (long)__src)));
      pbVar6[(long)(local_2088 + (2 - (long)__src))] = 0;
      sVar18 = 0x78;
      bVar2 = *pbVar6;
      if (bVar2 < 0x58) {
        if (bVar2 != 0x41) {
          if ((bVar2 != 0x45) && (bVar2 != 0x47)) goto switchD_0013fbd8_caseD_59;
          goto switchD_0013fbd8_caseD_65;
        }
switchD_0013fbd8_caseD_61:
        addlenmod(local_2088,"");
        auVar21 = vpbroadcastb_avx512bw(ZEXT116(0xab));
        auVar20 = vmovdqu64_avx512f(auVar21);
        *(undefined1 (*) [64])(*pauVar7 + 0x38) = auVar20;
        auVar20 = vmovdqu64_avx512f(auVar21);
        *pauVar7 = auVar20;
        luaL_checknumber(L,arg);
        iVar4 = snprintf((char *)pauVar7,0x78,local_2088);
        goto LAB_0013fcde;
      }
      switch(bVar2) {
      case 0x58:
      case 100:
      case 0x69:
      case 0x6f:
      case 0x75:
      case 0x78:
        pcVar10 = (char *)luaL_checkinteger(L,arg);
        addlenmod(local_2088,"ll");
        auVar20 = vpbroadcastb_avx512bw(ZEXT116(0xab));
        break;
      default:
switchD_0013fbd8_caseD_59:
        iVar5 = luaL_error(L,"invalid conversion \'%s\' to \'format\'",local_2088);
        return iVar5;
      case 0x61:
        goto switchD_0013fbd8_caseD_61;
      case 99:
        auVar21 = vpbroadcastb_avx512bw(ZEXT116(0xab));
        auVar20 = vmovdqu64_avx512f(auVar21);
        *(undefined1 (*) [64])(*pauVar7 + 0x38) = auVar20;
        auVar20 = vmovdqu64_avx512f(auVar21);
        *pauVar7 = auVar20;
        uVar11 = luaL_checkinteger(L,arg);
        iVar4 = snprintf((char *)pauVar7,0x78,local_2088,uVar11 & 0xffffffff);
        goto LAB_0013fcde;
      case 0x65:
      case 0x67:
        goto switchD_0013fbd8_caseD_65;
      case 0x66:
        pauVar7 = (undefined1 (*) [64])luaL_prepbuffsize(&local_2050,0x1a2);
        sVar18 = 0x1a2;
        goto switchD_0013fbd8_caseD_65;
      case 0x70:
        pcVar10 = (char *)lua_topointer(L,arg);
        if (pcVar10 == (char *)0x0) {
          sVar18 = strlen(local_2088);
          local_2088[sVar18 - 1] = 's';
          pcVar10 = "(null)";
        }
        auVar20 = vpbroadcastb_avx512bw(ZEXT116(0xab));
        break;
      case 0x71:
        if (local_2088[2] != '\0') {
          iVar5 = luaL_error(L,"specifier \'%%q\' cannot have modifiers");
          return iVar5;
        }
        uVar3 = lua_type(L,arg);
        pbVar17 = local_2098;
        if (uVar3 < 2) {
          iVar4 = 0;
          luaL_tolstring(L,arg,(size_t *)0x0);
          luaL_addvalue(&local_2050);
          pbVar17 = local_2098;
        }
        else if (uVar3 == 3) {
          pauVar7 = (undefined1 (*) [64])luaL_prepbuffsize(&local_2050,0x78);
          iVar5 = lua_isinteger(L,arg);
          if (iVar5 == 0) {
            lVar16 = lua_tonumberx(L,arg,(int *)0x0);
            pcVar10 = "1e9999";
            if (((INFINITY <= lVar16) || (pcVar10 = "-1e9999", lVar16 <= -INFINITY)) ||
               (pcVar10 = "(0/0)", NAN(lVar16))) {
              auVar21 = vpbroadcastb_avx512bw(ZEXT116(0xab));
              pcVar12 = "%s";
              auVar20 = vmovdqu64_avx512f(auVar21);
              *(undefined1 (*) [64])(*pauVar7 + 0x38) = auVar20;
              auVar20 = vmovdqu64_avx512f(auVar21);
              *pauVar7 = auVar20;
              goto LAB_0014019c;
            }
            auVar21 = vpbroadcastb_avx512bw(ZEXT116(0xab));
            auVar20 = vmovdqu64_avx512f(auVar21);
            *(undefined1 (*) [64])(*pauVar7 + 0x38) = auVar20;
            auVar20 = vmovdqu64_avx512f(auVar21);
            *pauVar7 = auVar20;
            iVar5 = snprintf((char *)pauVar7,0x78,"%a","(0/0)");
            pvVar8 = memchr(pauVar7,0x2e,(long)iVar5);
            if (pvVar8 == (void *)0x0) {
              plVar14 = localeconv();
              puVar15 = (undefined1 *)memchr(pauVar7,(int)*plVar14->decimal_point,(long)iVar5);
              if (puVar15 != (undefined1 *)0x0) {
                *puVar15 = 0x2e;
              }
            }
          }
          else {
            pcVar10 = (char *)lua_tointegerx(L,arg,(int *)0x0);
            auVar21 = vpbroadcastb_avx512bw(ZEXT116(0xab));
            pcVar12 = "%lld";
            auVar20 = vmovdqu64_avx512f(auVar21);
            *pauVar7 = auVar20;
            auVar20 = vmovdqu64_avx512f(auVar21);
            *(undefined1 (*) [64])(*pauVar7 + 0x38) = auVar20;
LAB_0014019c:
            iVar5 = snprintf((char *)pauVar7,0x78,pcVar12,pcVar10);
          }
          iVar4 = 0;
          local_2050.n = local_2050.n + (long)iVar5;
        }
        else if (uVar3 == 4) {
          pcVar10 = lua_tolstring(L,arg,(size_t *)&local_2060);
          local_20a0 = local_2060;
          if (local_2050.size <= local_2050.n) {
            luaL_prepbuffsize(&local_2050,1);
          }
          uVar11 = local_2050.n + 1;
          local_2050.b[local_2050.n] = '\"';
          local_2050.n = uVar11;
          if (local_20a0 != 0.0) {
            lVar16 = 0.0;
            do {
              bVar2 = pcVar10[(long)lVar16];
              if ((((ulong)bVar2 == 10) || (bVar2 == 0x5c)) || (bVar2 == 0x22)) {
                sVar13 = local_2050.n;
                if (local_2050.size <= local_2050.n) {
                  luaL_prepbuffsize(&local_2050,1);
                  sVar13 = local_2050.n;
                }
                local_2050.n = sVar13 + 1;
                local_2050.b[sVar13] = '\\';
                if (local_2050.size <= local_2050.n) {
                  luaL_prepbuffsize(&local_2050,1);
                }
                local_2050.b[local_2050.n] = pcVar10[(long)lVar16];
                local_2050.n = local_2050.n + 1;
              }
              else if (((*ppuVar9)[bVar2] & 2) == 0) {
                if (local_2050.size <= local_2050.n) {
                  luaL_prepbuffsize(&local_2050,1);
                  bVar2 = pcVar10[(long)lVar16];
                }
                local_2050.b[local_2050.n] = bVar2;
                local_2050.n = local_2050.n + 1;
              }
              else {
                local_20a8 = 0xabab;
                local_20b0 = 0xabababababababab;
                pcVar12 = "\\%d";
                if (((*ppuVar9)[(byte)pcVar10[(long)lVar16 + 1]] >> 0xb & 1) != 0) {
                  pcVar12 = "\\%03d";
                }
                snprintf((char *)&local_20b0,10,pcVar12);
                luaL_addstring(&local_2050,(char *)&local_20b0);
              }
              lVar16 = (lua_Number)((long)lVar16 + 1);
            } while (local_20a0 != lVar16);
          }
          if (local_2050.size <= local_2050.n) {
            luaL_prepbuffsize(&local_2050,1);
          }
          iVar4 = 0;
          local_2050.b[local_2050.n] = '\"';
          local_2050.n = local_2050.n + 1;
        }
        else {
          luaL_argerror(L,arg,"value has no literal form");
          iVar4 = 0;
        }
        goto LAB_0013ff9f;
      case 0x73:
        pcVar10 = luaL_tolstring(L,arg,&local_20b0);
        sVar13 = local_20b0;
        if (local_2088[2] == '\0') {
LAB_0013fd4e:
          luaL_addvalue(&local_2050);
          iVar4 = 0;
        }
        else {
          sVar18 = strlen(pcVar10);
          if (sVar13 != sVar18) {
            luaL_argerror(L,arg,"string contains zeros");
            sVar13 = local_20b0;
          }
          pcVar12 = strchr(local_2088,0x2e);
          if ((pcVar12 == (char *)0x0) && (99 < sVar13)) goto LAB_0013fd4e;
          auVar21 = vpbroadcastb_avx512bw(ZEXT116(0xab));
          auVar20 = vmovdqu64_avx512f(auVar21);
          *(undefined1 (*) [64])(*pauVar7 + 0x38) = auVar20;
          auVar20 = vmovdqu64_avx512f(auVar21);
          *pauVar7 = auVar20;
          iVar4 = snprintf((char *)pauVar7,0x78,local_2088,pcVar10);
          lua_settop(L,-2);
        }
        iVar5 = 0x78;
        goto LAB_0013ff91;
      }
      auVar21 = vmovdqu64_avx512f(auVar20);
      *(undefined1 (*) [64])(*pauVar7 + 0x38) = auVar21;
      auVar20 = vmovdqu64_avx512f(auVar20);
      *pauVar7 = auVar20;
      iVar4 = snprintf((char *)pauVar7,0x78,local_2088,pcVar10);
LAB_0013fcde:
      iVar5 = 0x78;
LAB_0013ff91:
      pbVar17 = local_2098;
      if (iVar5 <= iVar4) {
        __assert_fail("nb < maxitem",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lstrlib.c"
                      ,0x51d,"int str_format(lua_State *)");
      }
LAB_0013ff9f:
      pbVar6 = pbVar6 + 1;
      iVar5 = arg;
      local_2050.n = local_2050.n + (long)iVar4;
LAB_0013ffaa:
    } while (pbVar6 < pbVar17);
  }
  luaL_pushresult(&local_2050);
  return 1;
switchD_0013fbd8_caseD_65:
  iVar5 = (int)sVar18;
  local_20a0 = luaL_checknumber(L,arg);
  addlenmod(local_2088,"");
  memset(pauVar7,0xab,sVar18);
  iVar4 = snprintf((char *)pauVar7,sVar18,local_2088,local_20a0);
  goto LAB_0013ff91;
}

Assistant:

static int str_format (lua_State *L) {
  int top = lua_gettop(L);
  int arg = 1;
  size_t sfl;
  const char *strfrmt = luaL_checklstring(L, arg, &sfl);
  const char *strfrmt_end = strfrmt+sfl;
  luaL_Buffer b;
  luaL_buffinit(L, &b);
  while (strfrmt < strfrmt_end) {
    if (*strfrmt != L_ESC)
      luaL_addchar(&b, *strfrmt++);
    else if (*++strfrmt == L_ESC)
      luaL_addchar(&b, *strfrmt++);  /* %% */
    else { /* format item */
      char form[MAX_FORMAT];  /* to store the format ('%...') */
      int maxitem = MAX_ITEM;
      char *buff = luaL_prepbuffsize(&b, maxitem);  /* to put formatted item */
      int nb = 0;  /* number of bytes in added item */
      if (++arg > top)
        return luaL_argerror(L, arg, "no value");
      strfrmt = scanformat(L, strfrmt, form);
      switch (*strfrmt++) {
        case 'c': {
          nb = l_sprintf(buff, maxitem, form, (int)luaL_checkinteger(L, arg));
          break;
        }
        case 'd': case 'i':
        case 'o': case 'u': case 'x': case 'X': {
          lua_Integer n = luaL_checkinteger(L, arg);
          addlenmod(form, LUA_INTEGER_FRMLEN);
          nb = l_sprintf(buff, maxitem, form, (LUAI_UACINT)n);
          break;
        }
        case 'a': case 'A':
          addlenmod(form, LUA_NUMBER_FRMLEN);
          nb = lua_number2strx(L, buff, maxitem, form,
                                  luaL_checknumber(L, arg));
          break;
        case 'f':
          maxitem = MAX_ITEMF;  /* extra space for '%f' */
          buff = luaL_prepbuffsize(&b, maxitem);
          /* FALLTHROUGH */
        case 'e': case 'E': case 'g': case 'G': {
          lua_Number n = luaL_checknumber(L, arg);
          addlenmod(form, LUA_NUMBER_FRMLEN);
          nb = l_sprintf(buff, maxitem, form, (LUAI_UACNUMBER)n);
          break;
        }
        case 'p': {
          const void *p = lua_topointer(L, arg);
          if (p == NULL) {  /* avoid calling 'printf' with argument NULL */
            p = "(null)";  /* result */
            form[strlen(form) - 1] = 's';  /* format it as a string */
          }
          nb = l_sprintf(buff, maxitem, form, p);
          break;
        }
        case 'q': {
          if (form[2] != '\0')  /* modifiers? */
            return luaL_error(L, "specifier '%%q' cannot have modifiers");
          addliteral(L, &b, arg);
          break;
        }
        case 's': {
          size_t l;
          const char *s = luaL_tolstring(L, arg, &l);
          if (form[2] == '\0')  /* no modifiers? */
            luaL_addvalue(&b);  /* keep entire string */
          else {
            luaL_argcheck(L, l == strlen(s), arg, "string contains zeros");
            if (!strchr(form, '.') && l >= 100) {
              /* no precision and string is too long to be formatted */
              luaL_addvalue(&b);  /* keep entire string */
            }
            else {  /* format the string into 'buff' */
              nb = l_sprintf(buff, maxitem, form, s);
              lua_pop(L, 1);  /* remove result from 'luaL_tolstring' */
            }
          }
          break;
        }
        default: {  /* also treat cases 'pnLlh' */
          return luaL_error(L, "invalid conversion '%s' to 'format'", form);
        }
      }
      lua_assert(nb < maxitem);
      luaL_addsize(&b, nb);
    }
  }
  luaL_pushresult(&b);
  return 1;
}